

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O2

void __thiscall
Enterprise::ConcreteMachine<false,_false>::ConcreteMachine
          (ConcreteMachine<false,_false> *this,Target *target,ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  PullLowpass<Enterprise::Dave::Audio> *this_01;
  array<unsigned_char,_65536UL> *__s;
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  Target *pTVar3;
  bool bVar4;
  iterator iVar5;
  iterator iVar6;
  undefined4 *puVar7;
  byte bVar8;
  size_t sVar9;
  long lVar10;
  _Base_ptr __src;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *this_02;
  array<unsigned_char,_16384UL> *__s_00;
  Media *this_03;
  Node local_238;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  Name rom_name;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_1a0;
  Node local_188;
  Target *local_160;
  Request local_158;
  Node local_130;
  EXDos *local_108;
  PullLowpass<Enterprise::Dave::Audio> *local_100;
  AsyncTaskQueue<false,_true,_void> *local_f8;
  NickType *local_f0;
  Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false> *local_e8;
  MappedKeyboardMachine *local_e0;
  array<unsigned_char,_65536UL> *local_d8;
  Request local_d0;
  Request local_a8;
  Request local_80;
  Request local_58;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_0057cd40;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR___cxa_pure_virtual_00584df0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_00584e10;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  p_Var1 = &roms._M_t._M_impl.super__Rb_tree_header;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).previous_typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).character_mapper.super_CharacterMapper.
  _vptr_CharacterMapper = (_func_int **)&PTR__CharacterMapper_00585a88;
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_00584ad0;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00584b70;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00584b90;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00584bb0;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00584bc8;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00584bf8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00584c38;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00584c50;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00584c88;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).super_Delegate.super_KeyActions.
  _vptr_KeyActions = (_func_int **)&PTR_set_key_state_00584cd0;
  memset(&this->ram_,0,0x40000);
  bVar8 = 0xfc;
  if (target->model != Enterprise64) {
    bVar8 = (target->model != Enterprise256) << 3 | 0xf0;
  }
  this->min_ram_slot_ = bVar8;
  this->write_pointers_[2] = (uint8_t *)0x0;
  this->write_pointers_[3] = (uint8_t *)0x0;
  this->write_pointers_[0] = (uint8_t *)0x0;
  this->write_pointers_[1] = (uint8_t *)0x0;
  this->read_pointers_[2] = (uint8_t *)0x0;
  this->read_pointers_[3] = (uint8_t *)0x0;
  this->read_pointers_[0] = (uint8_t *)0x0;
  this->read_pointers_[1] = (uint8_t *)0x0;
  this->pages_[0] = 0x80;
  this->pages_[1] = 0x80;
  this->pages_[2] = 0x80;
  this->pages_[3] = 0x80;
  this->wait_mode_ = OnAllAccesses;
  this->is_video_[0] = false;
  this->is_video_[1] = false;
  this->is_video_[2] = false;
  this->is_video_[3] = false;
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_00585a58;
  this->active_key_line_ = '\0';
  this->should_skip_splash_screen_ = false;
  this->typer_delay_ = 0x1e;
  this->interrupt_mask_ = '\0';
  this->interrupt_state_ = '\0';
  local_e8 = &this->z80_;
  local_160 = target;
  local_e0 = &this->super_MappedKeyboardMachine;
  CPU::Z80::Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false>::Processor
            (local_e8,this);
  local_f0 = &this->nick_;
  roms._M_t._M_impl._0_8_ = (this->ram_)._M_elems + 0x30000;
  JustInTimeActor<Enterprise::Nick,HalfCycles,40434603,11360000>::JustInTimeActor<unsigned_char*>
            ((JustInTimeActor<Enterprise::Nick,HalfCycles,40434603,11360000> *)local_f0,
             (uchar **)&roms);
  this->previous_nick_interrupt_line_ = false;
  this_00 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  local_f8 = this_00;
  Dave::Audio::Audio(&this->dave_audio_,this_00);
  this_01 = &this->speaker_;
  Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>::PullLowpass(this_01,&this->dave_audio_);
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->dave_delay_).super_WrappedInt<HalfCycles>.length_ = 2;
  JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::JustInTimeActor<>
            (&this->dave_timer_);
  local_108 = &this->exdos_;
  local_100 = this_01;
  EXDos::EXDos(local_108);
  (this->super_TimedMachine).clock_rate_ = 4000000.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>::
  set_input_rate(&this_01->
                  super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>,
                 500000.0);
  pTVar3 = local_160;
  request.node.type = One;
  request.node.name = None;
  request.node.is_optional = false;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(local_160->exos_version) {
  case v10:
    ROM::Request::Request((Request *)&local_238,EnterpriseEXOS10,false);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    break;
  case v20:
    ROM::Request::Request((Request *)&local_238,EnterpriseEXOS20,false);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    break;
  case v21:
    ROM::Request::Request((Request *)&local_238,EnterpriseEXOS21,false);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    break;
  case v23:
    ROM::Request::Request((Request *)&local_238,EnterpriseEXOS23,false);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    break;
  case Any:
    ROM::Request::Request((Request *)&local_130,EnterpriseEXOS10,false);
    ROM::Request::Request(&local_158,EnterpriseEXOS20,false);
    ROM::Request::operator||((Request *)&local_188,(Request *)&local_130,&local_158);
    ROM::Request::Request(&local_a8,EnterpriseEXOS21,false);
    ROM::Request::operator||((Request *)&rom_name,(Request *)&local_188,&local_a8);
    ROM::Request::Request(&local_d0,EnterpriseEXOS23,false);
    ROM::Request::operator||((Request *)&local_238,(Request *)&rom_name,&local_d0);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_238.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_d0.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1a0);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_a8.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_158.node.children);
    pNVar2 = &local_130;
    goto LAB_002f8547;
  default:
    goto switchD_002f8388_default;
  }
  ROM::Request::Node::operator=(&request.node,(Node *)&roms);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  pNVar2 = &local_238;
LAB_002f8547:
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&pNVar2->children);
switchD_002f8388_default:
  switch(pTVar3->basic_version) {
  case v10:
    ROM::Request::Request((Request *)&rom_name,EnterpriseBASIC10,false);
    ROM::Request::Request((Request *)&local_130,EnterpriseBASIC10Part1,false);
    ROM::Request::Request(&local_158,EnterpriseBASIC10Part2,false);
    ROM::Request::operator&&((Request *)&local_188,(Request *)&local_130,&local_158);
    ROM::Request::operator||((Request *)&local_238,(Request *)&rom_name,(Request *)&local_188);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_238.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_158.node.children);
    pNVar2 = &local_130;
    goto LAB_002f8855;
  case v11:
    ROM::Request::Request((Request *)&rom_name,EnterpriseBASIC11,false);
    ROM::Request::Request((Request *)&local_188,EnterpriseBASIC11Suffixed,false);
    ROM::Request::operator||((Request *)&local_238,(Request *)&rom_name,(Request *)&local_188);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_238.children);
    pNVar2 = &local_188;
LAB_002f8855:
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&pNVar2->children)
    ;
    this_02 = &local_1a0;
    break;
  case v21:
    ROM::Request::Request((Request *)&local_238,EnterpriseBASIC21,false);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    this_02 = &local_238.children;
    break;
  case Any:
    ROM::Request::Request((Request *)&local_130,EnterpriseBASIC10,false);
    ROM::Request::Request(&local_a8,EnterpriseBASIC10Part1,false);
    ROM::Request::Request(&local_d0,EnterpriseBASIC10Part2,false);
    ROM::Request::operator&&(&local_158,&local_a8,&local_d0);
    ROM::Request::operator||((Request *)&local_188,(Request *)&local_130,&local_158);
    ROM::Request::Request(&local_58,EnterpriseBASIC11,false);
    ROM::Request::operator||((Request *)&rom_name,(Request *)&local_188,&local_58);
    ROM::Request::Request(&local_80,EnterpriseBASIC21,false);
    ROM::Request::operator||((Request *)&local_238,(Request *)&rom_name,&local_80);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_238.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_80.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1a0);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_58.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_158.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_d0.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_a8.node.children);
    this_02 = &local_130.children;
    break;
  default:
    goto switchD_002f856b_default;
  }
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(this_02);
switchD_002f856b_default:
  if (pTVar3->dos == EXDOS) {
    ROM::Request::Request((Request *)&local_238,EnterpriseEXDOS,false);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)&local_238);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_238.children);
  }
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,rom_fetcher,&request);
  bVar4 = ROM::Request::validate(&request,&roms);
  if (!bVar4) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&ROMMachine::Error::typeinfo,0);
  }
  __s = &this->exos_;
  memset(__s,0xff,0x10000);
  local_238.type = 0x2f;
  local_238.name = EnterpriseEXOS20;
  local_238.is_optional = true;
  local_238._9_7_ = 0x32000000;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 4) {
    rom_name = *(Name *)((long)&local_238.type + lVar10);
    iVar5 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&rom_name);
    if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
      sVar9 = (long)iVar5._M_node[1]._M_left - (long)iVar5._M_node[1]._M_parent;
      if (0xffff < sVar9) {
        sVar9 = 0x10000;
      }
      memcpy(__s,iVar5._M_node[1]._M_parent,sVar9);
      break;
    }
  }
  __s_00 = &this->basic_;
  local_d8 = __s;
  memset(__s_00,0xff,0x4000);
  local_238.type = 0x33;
  local_238.name = EnterpriseBASIC11;
  local_238.is_optional = true;
  local_238._9_7_ = 0x38000000;
  lVar10 = 0;
  do {
    if (lVar10 == 0x10) {
      local_238.type = 0x34;
      iVar5 = std::
              _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&roms._M_t,&local_238.type);
      local_238.type = 0x35;
      iVar6 = std::
              _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&roms._M_t,&local_238.type);
      if ((_Rb_tree_header *)iVar6._M_node != p_Var1 && (_Rb_tree_header *)iVar5._M_node != p_Var1)
      {
        sVar9 = (long)iVar5._M_node[1]._M_left - (long)iVar5._M_node[1]._M_parent;
        if (0x1fff < sVar9) {
          sVar9 = 0x2000;
        }
        memcpy(__s_00,iVar5._M_node[1]._M_parent,sVar9);
        __s_00 = (array<unsigned_char,_16384UL> *)((this->basic_)._M_elems + 0x2000);
        __src = iVar6._M_node[1]._M_parent;
        sVar9 = (long)iVar6._M_node[1]._M_left - (long)__src;
        if (0x1fff < sVar9) {
          sVar9 = 0x2000;
        }
LAB_002f8a4f:
        memcpy(__s_00,__src,sVar9);
      }
      memset(&this->epdos_rom_,0xff,0x8000);
      local_238.type = 0x39;
      iVar5 = std::
              _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&roms._M_t,&local_238.type);
      pTVar3 = local_160;
      if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
        sVar9 = (long)iVar5._M_node[1]._M_left - (long)iVar5._M_node[1]._M_parent;
        if (0x7fff < sVar9) {
          sVar9 = 0x8000;
        }
        memcpy(&this->epdos_rom_,iVar5._M_node[1]._M_parent,sVar9);
      }
      memset(&this->exdos_rom_,0xff,0x4000);
      local_238.type = 0x3a;
      iVar5 = std::
              _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&roms._M_t,&local_238.type);
      if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
        sVar9 = (long)iVar5._M_node[1]._M_left - (long)iVar5._M_node[1]._M_parent;
        if (0x3fff < sVar9) {
          sVar9 = 0x4000;
        }
        memcpy(&this->exdos_rom_,iVar5._M_node[1]._M_parent,sVar9);
      }
      (this->key_lines_)._M_elems[8] = 0xff;
      (this->key_lines_)._M_elems[9] = 0xff;
      (this->key_lines_)._M_elems[0] = 0xff;
      (this->key_lines_)._M_elems[1] = 0xff;
      (this->key_lines_)._M_elems[2] = 0xff;
      (this->key_lines_)._M_elems[3] = 0xff;
      (this->key_lines_)._M_elems[4] = 0xff;
      (this->key_lines_)._M_elems[5] = 0xff;
      (this->key_lines_)._M_elems[6] = 0xff;
      (this->key_lines_)._M_elems[7] = 0xff;
      this->read_pointers_[0] = local_d8->_M_elems;
      this->write_pointers_[0] = (uint8_t *)0x0;
      this->write_pointers_[1] = (uint8_t *)0x0;
      this->read_pointers_[1] = (this->ram_)._M_elems + 0x3c000;
      this->read_pointers_[2] = (this->ram_)._M_elems + 0x38000;
      this->write_pointers_[2] = (uint8_t *)0x0;
      this->write_pointers_[3] = (uint8_t *)0x0;
      this->pages_[0] = '\0';
      this->pages_[1] = '\0';
      this->pages_[2] = '\0';
      this->pages_[3] = '\0';
      this->read_pointers_[3] = (this->ram_)._M_elems + 0x34000;
      this->is_video_[0] = false;
      this->is_video_[1] = false;
      this->is_video_[2] = false;
      this->is_video_[3] = false;
      if ((pTVar3->loading_command)._M_string_length != 0) {
        type_string(this,&pTVar3->loading_command);
      }
      this_03 = &(pTVar3->super_Target).media;
      bVar4 = Analyser::Static::Media::empty(this_03);
      if (!bVar4) {
        bVar4 = Analyser::Static::Media::empty(this_03);
        this->should_skip_splash_screen_ = !bVar4;
        this->typer_delay_ = 2;
      }
      std::
      _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~_Rb_tree(&roms._M_t);
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
                (&request.node.children);
      return;
    }
    rom_name = *(Name *)((long)&local_238.type + lVar10);
    iVar5 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&rom_name);
    if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
      __src = iVar5._M_node[1]._M_parent;
      sVar9 = (long)iVar5._M_node[1]._M_left - (long)__src;
      if (0x3fff < sVar9) {
        sVar9 = 0x4000;
      }
      goto LAB_002f8a4f;
    }
    lVar10 = lVar10 + 4;
  } while( true );
}

Assistant:

ConcreteMachine(const Analyser::Static::Enterprise::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			min_ram_slot_(min_ram_slot(target)),
			z80_(*this),
			nick_(ram_.end() - 65536),
			dave_audio_(audio_queue_),
			speaker_(dave_audio_) {

			// Request a clock of 4Mhz; this'll be mapped upwards for Nick and downwards for Dave elsewhere.
			set_clock_rate(clock_rate);
			speaker_.set_input_rate(float(clock_rate) / float(dave_divider));

			ROM::Request request;
			using Target = Analyser::Static::Enterprise::Target;

			// Pick one or more EXOS ROMs.
			switch(target.exos_version) {
				case Target::EXOSVersion::v10:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS10);	break;
				case Target::EXOSVersion::v20:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS20);	break;
				case Target::EXOSVersion::v21:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS21);	break;
				case Target::EXOSVersion::v23:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS23);	break;
				case Target::EXOSVersion::Any:
					request =
						request && (
							ROM::Request(ROM::Name::EnterpriseEXOS10) || ROM::Request(ROM::Name::EnterpriseEXOS20) ||
							ROM::Request(ROM::Name::EnterpriseEXOS21) || ROM::Request(ROM::Name::EnterpriseEXOS23)
						);
				break;

				default: break;
			}

			// Similarly pick one or more BASIC ROMs.
			switch(target.basic_version) {
				case Target::BASICVersion::v10:
					request = request && (
						ROM::Request(ROM::Name::EnterpriseBASIC10) ||
						(ROM::Request(ROM::Name::EnterpriseBASIC10Part1) && ROM::Request(ROM::Name::EnterpriseBASIC10Part2))
					);
				break;
				case Target::BASICVersion::v11:
					request = request && (
						ROM::Request(ROM::Name::EnterpriseBASIC11) ||
						ROM::Request(ROM::Name::EnterpriseBASIC11Suffixed)
					);
				break;
				case Target::BASICVersion::v21:
					request = request && ROM::Request(ROM::Name::EnterpriseBASIC21);
				break;
				case Target::BASICVersion::Any:
					request =
						request && (
							ROM::Request(ROM::Name::EnterpriseBASIC10) ||
							(ROM::Request(ROM::Name::EnterpriseBASIC10Part1) && ROM::Request(ROM::Name::EnterpriseBASIC10Part2)) ||
							ROM::Request(ROM::Name::EnterpriseBASIC11) ||
							ROM::Request(ROM::Name::EnterpriseBASIC21)
						);
				break;

				default: break;
			}

			// Possibly add in a DOS.
			switch(target.dos) {
				case Target::DOS::EXDOS:			request = request && ROM::Request(ROM::Name::EnterpriseEXDOS);	break;
				default: break;
			}

			// Get and validate ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// Extract the appropriate EXOS ROM.
			exos_.fill(0xff);
			for(const auto rom_name: { ROM::Name::EnterpriseEXOS10, ROM::Name::EnterpriseEXOS20, ROM::Name::EnterpriseEXOS21, ROM::Name::EnterpriseEXOS23 }) {
				const auto exos = roms.find(rom_name);
				if(exos != roms.end()) {
					memcpy(exos_.data(), exos->second.data(), std::min(exos_.size(), exos->second.size()));
					break;
				}
			}

			// Extract the appropriate BASIC ROM[s] (if any).
			basic_.fill(0xff);
			bool has_basic = false;
			for(const auto rom_name: { ROM::Name::EnterpriseBASIC10, ROM::Name::EnterpriseBASIC11, ROM::Name::EnterpriseBASIC11Suffixed, ROM::Name::EnterpriseBASIC21 }) {
				const auto basic = roms.find(rom_name);
				if(basic != roms.end()) {
					memcpy(basic_.data(), basic->second.data(), std::min(basic_.size(), basic->second.size()));
					has_basic = true;
					break;
				}
			}
			if(!has_basic) {
				const auto basic1 = roms.find(ROM::Name::EnterpriseBASIC10Part1);
				const auto basic2 = roms.find(ROM::Name::EnterpriseBASIC10Part2);
				if(basic1 != roms.end() && basic2 != roms.end()) {
					memcpy(&basic_[0x0000], basic1->second.data(), std::min(size_t(8192), basic1->second.size()));
					memcpy(&basic_[0x2000], basic2->second.data(), std::min(size_t(8192), basic2->second.size()));
				}
			}

			// Extract the appropriate DOS ROMs.
			epdos_rom_.fill(0xff);
			const auto epdos = roms.find(ROM::Name::EnterpriseEPDOS);
			if(epdos != roms.end()) {
				memcpy(epdos_rom_.data(), epdos->second.data(), std::min(epdos_rom_.size(), epdos->second.size()));
			}
			exdos_rom_.fill(0xff);
			const auto exdos = roms.find(ROM::Name::EnterpriseEXDOS);
			if(exdos != roms.end()) {
				memcpy(exdos_rom_.data(), exdos->second.data(), std::min(exdos_rom_.size(), exdos->second.size()));
			}

			// Seed key state.
			clear_all_keys();

			// Take a reasonable guess at the initial memory configuration:
			// put EXOS into the first bank since this is a Z80 and therefore
			// starts from address 0; the third instruction in EXOS is a jump
			// to $c02e so it's reasonable to assume EXOS is in the highest bank
			// too, and it appears to act correctly if it's the first 16kb that's
			// in the highest bank. From there I guess: all banks are initialised
			// to 0.
			page<0>(0x00);
			page<1>(0x00);
			page<2>(0x00);
			page<3>(0x00);

			// Pass on any media.
			insert_media(target.media);
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			// Ensure the splash screen is automatically skipped if any media has been provided.
			if(!target.media.empty()) {
				should_skip_splash_screen_ = !target.media.empty();
				typer_delay_ = 2;
			}
		}